

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

void __thiscall
cmMakefile::SetGlobalTargetImportScope::SetGlobalTargetImportScope
          (SetGlobalTargetImportScope *this,cmMakefile *mk,ImportedTargetScope scope)

{
  bool bVar1;
  ImportedTargetScope scope_local;
  cmMakefile *mk_local;
  SetGlobalTargetImportScope *this_local;
  
  this->Makefile = mk;
  if ((scope == Global) && (bVar1 = IsImportedTargetGlobalScope(this->Makefile), !bVar1)) {
    this->Makefile->CurrentImportedTargetScope = Global;
    this->Set = true;
    return;
  }
  this->Set = false;
  return;
}

Assistant:

SetGlobalTargetImportScope(cmMakefile* mk, ImportedTargetScope const scope)
      : Makefile(mk)
    {
      if (scope == ImportedTargetScope::Global &&
          !this->Makefile->IsImportedTargetGlobalScope()) {
        this->Makefile->CurrentImportedTargetScope = scope;
        this->Set = true;
      } else {
        this->Set = false;
      }
    }